

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<double,std::allocator<double>>>>::
initialize<tinyusdz::Animatable<std::vector<double,std::allocator<double>>>>
          (optional<tinyusdz::Animatable<std::vector<double,std::allocator<double>>>> *this,
          Animatable<std::vector<double,_std::allocator<double>_>_> *value)

{
  if (*this != (optional<tinyusdz::Animatable<std::vector<double,std::allocator<double>>>>)0x1) {
    *(pointer *)(this + 8) =
         (value->_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x10) =
         (value->_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    *(pointer *)(this + 0x18) =
         (value->_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (value->_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (value->_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (value->_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined2 *)(this + 0x20) = *(undefined2 *)&value->_has_value;
    *(pointer *)(this + 0x28) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<double,_std::allocator<double>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<double,_std::allocator<double>_>_>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x30) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<double,_std::allocator<double>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<double,_std::allocator<double>_>_>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(this + 0x38) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<double,_std::allocator<double>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<double,_std::allocator<double>_>_>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<double,_std::allocator<double>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<double,_std::allocator<double>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<double,_std::allocator<double>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<double,_std::allocator<double>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<double,_std::allocator<double>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<double,_std::allocator<double>_>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this[0x40] = (optional<tinyusdz::Animatable<std::vector<double,std::allocator<double>>>>)
                 (value->_ts)._dirty;
    *this = (optional<tinyusdz::Animatable<std::vector<double,std::allocator<double>>>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<double>>>::initialize(V &&) [T = tinyusdz::Animatable<std::vector<double>>, V = tinyusdz::Animatable<std::vector<double>>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }